

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::ComputeFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  char *in_name;
  char *pcVar2;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = this->GeneratorTarget;
  std::__cxx11::string::string((string *)&local_40,"Fortran_MODULE_DIRECTORY",&local_41);
  in_name = cmGeneratorTarget::GetProperty(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this_01 = this->Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_Fortran_MODDIR_FLAG",&local_41);
  pcVar2 = cmMakefile::GetDefinition(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((in_name != (char *)0x0) && (pcVar2 != (char *)0x0)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar1) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      cmLocalGenerator::GetCurrentBinaryDirectory(&this->LocalGenerator->super_cmLocalGenerator);
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeFortranModuleDirectory() const
{
  std::string mod_dir;
  const char* target_mod_dir =
    this->GeneratorTarget->GetProperty("Fortran_MODULE_DIRECTORY");
  const char* moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if(target_mod_dir && moddir_flag)
    {
    // Compute the full path to the module directory.
    if(cmSystemTools::FileIsFullPath(target_mod_dir))
      {
      // Already a full path.
      mod_dir = target_mod_dir;
      }
    else
      {
      // Interpret relative to the current output directory.
      mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
      mod_dir += "/";
      mod_dir += target_mod_dir;
      }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
    }
  return mod_dir;
}